

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O0

long __thiscall gl4cts::AdvancedManyDrawCalls2::Setup(AdvancedManyDrawCalls2 *this)

{
  AdvancedManyDrawCalls2 *this_local;
  
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->m_acbo);
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->m_ssbo);
  glu::CallLogWrapper::glGenVertexArrays
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->m_vao);
  glu::CallLogWrapper::glGenProgramPipelines
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->m_ppo);
  this->m_fsp = 0;
  this->m_vsp = 0;
  return 0;
}

Assistant:

virtual long Setup()
	{
		glGenBuffers(1, &m_acbo);
		glGenBuffers(1, &m_ssbo);
		glGenVertexArrays(1, &m_vao);
		glGenProgramPipelines(1, &m_ppo);
		m_vsp = m_fsp = 0;
		return NO_ERROR;
	}